

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  URLPattern *pUVar1;
  anon_union_40_3_e2f18bb4_for_content *paVar2;
  byte bVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  unsigned_long *puVar12;
  unsigned_long uVar13;
  int iVar14;
  size_t sVar15;
  char *pcVar16;
  URLGlob *glob_00;
  ushort **ppuVar17;
  char **ppcVar18;
  char *__dest;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  FILE *pFVar22;
  byte *pbVar23;
  ulong uVar24;
  byte **ppbVar25;
  ulong uVar26;
  uint uVar27;
  anon_union_40_3_e2f18bb4_for_content *paVar28;
  byte *pbVar29;
  byte *pbVar30;
  CURLcode CVar31;
  byte *pbVar32;
  char end_c;
  char max_c;
  char min_c;
  char *endp;
  byte *local_100;
  byte *local_f8;
  char local_e7;
  char local_e6;
  char local_e5;
  int local_e4;
  unsigned_long local_e0;
  URLPattern *local_d8;
  FILE *local_d0;
  unsigned_long *local_c8;
  URLGlob **local_c0;
  byte *local_b8 [17];
  
  *glob = (URLGlob *)0x0;
  local_c0 = glob;
  sVar15 = strlen(url);
  pcVar16 = (char *)malloc(sVar15 + 1);
  if (pcVar16 != (char *)0x0) {
    *pcVar16 = '\0';
    local_e0 = 1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar15;
      glob_00->glob_buffer = pcVar16;
      CVar31 = CURLE_OK;
      local_e4 = 0;
      pbVar23 = (byte *)0x1;
      local_d0 = error;
      local_c8 = urlnum;
LAB_00116356:
      if ((*url != 0) && (CVar31 == CURLE_OK)) {
        pbVar29 = (byte *)glob_00->glob_buffer;
        sVar15 = 0;
        local_f8 = pbVar23;
        do {
          for (; bVar3 = *url, bVar3 != 0x5b; url = (char *)((byte *)url + 1)) {
            if (0x5c < bVar3) {
              if (bVar3 != 0x5d) {
                if (bVar3 == 0x7b) goto LAB_00116489;
                if (bVar3 != 0x7d) goto LAB_0011646b;
              }
              pcVar16 = "unmatched close brace/bracket";
              goto LAB_00116b75;
            }
            if (bVar3 == 0) goto LAB_00116489;
            if (((bVar3 == 0x5c) && (((byte *)url)[1] - 0x5b < 0x23)) &&
               ((0x500000005U >> ((ulong)(((byte *)url)[1] - 0x5b) & 0x3f) & 1) != 0)) {
              url = (char *)((byte *)url + 1);
              local_f8 = local_f8 + 1;
            }
LAB_0011646b:
            *pbVar29 = *url;
            pbVar29 = pbVar29 + 1;
            local_f8 = local_f8 + 1;
            sVar15 = sVar15 + 1;
          }
          ppuVar17 = __ctype_b_loc();
          pFVar22 = (FILE *)0x2;
          uVar26 = 0;
          do {
            bVar3 = ((byte *)url + -1)[(long)pFVar22];
            bVar11 = true;
            if (((*ppuVar17)[bVar3] & 8) == 0) {
              if (bVar3 < 0x3a) {
                if ((bVar3 != 0x25) && (bVar3 != 0x2e)) {
LAB_001163cf:
                  bVar11 = false;
                  pbVar23 = (byte *)0x0;
                }
              }
              else if (bVar3 == 0x5d) {
                pbVar23 = (byte *)(ulong)(1 < uVar26);
                bVar11 = false;
                error = pFVar22;
              }
              else {
                if (bVar3 != 0x3a) goto LAB_001163cf;
                uVar26 = uVar26 + 1;
              }
            }
            pFVar22 = (FILE *)((long)&pFVar22->_flags + 1);
          } while (bVar11);
          if (((ulong)pbVar23 & 1) != 0) {
            memcpy(pbVar29,url,(size_t)error);
            pbVar29 = pbVar29 + (long)error;
            url = (char *)((byte *)url + (long)error);
            sVar15 = (long)&error->_flags + sVar15;
          }
        } while (((ulong)pbVar23 & 1) != 0);
LAB_00116489:
        if (sVar15 == 0) {
          if (*url != 0x5b) {
            if (*url == 0x7b) {
              sVar4 = glob_00->size;
              pbVar23 = (byte *)glob_00->glob_buffer;
              glob_00->pattern[sVar4].type = UPTSet;
              paVar28 = &glob_00->pattern[sVar4].content;
              paVar2 = &glob_00->pattern[sVar4].content;
              (paVar2->Set).elements = (char **)0x0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->min_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->max_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->ptr_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->field_0x3 = 0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->step = 0;
              glob_00->pattern[sVar4].globindex = local_e4;
              local_e4 = local_e4 + 1;
              pbVar29 = local_f8;
              pbVar30 = (byte *)url + 1;
              do {
                pbVar32 = pbVar29 + 1;
                bVar3 = *pbVar30;
                if (bVar3 < 0x5c) {
                  uVar13 = local_e0;
                  if (bVar3 != 0x2c) {
                    if (bVar3 != 0) {
                      if (bVar3 != 0x5b) goto LAB_001166f6;
LAB_0011699e:
                      pcVar16 = "nested brace";
                      goto LAB_00116a3f;
                    }
                    glob_00->error = "unmatched brace";
                    glob_00->pos = (size_t)local_f8;
                    goto LAB_00116a4d;
                  }
LAB_00116631:
                  local_e0 = uVar13;
                  *pbVar23 = 0;
                  if ((paVar28->Set).elements != (char **)0x0) {
                    ppcVar18 = (char **)realloc((paVar28->Set).elements,
                                                (long)glob_00->pattern[sVar4].content.Set.size * 8 +
                                                8);
                    if (ppcVar18 != (char **)0x0) {
                      (paVar28->Set).elements = ppcVar18;
                      goto LAB_0011668b;
                    }
                    glob_00->error = "out of memory";
                    glob_00->pos = 0;
LAB_0011686b:
                    CVar31 = CURLE_OUT_OF_MEMORY;
                    local_f8 = pbVar32;
                    goto LAB_00116a53;
                  }
                  ppcVar18 = (char **)malloc(8);
                  (paVar28->Set).elements = ppcVar18;
LAB_0011668b:
                  ppcVar18 = (paVar28->Set).elements;
                  if (ppcVar18 == (char **)0x0) {
LAB_0011684d:
                    glob_00->error = "out of memory";
                    glob_00->pos = 0;
                    goto LAB_0011686b;
                  }
                  pcVar16 = strdup(glob_00->glob_buffer);
                  ppcVar18[glob_00->pattern[sVar4].content.Set.size] = pcVar16;
                  iVar14 = glob_00->pattern[sVar4].content.Set.size;
                  if (glob_00->pattern[sVar4].content.Set.elements[iVar14] == (char *)0x0)
                  goto LAB_0011684d;
                  glob_00->pattern[sVar4].content.Set.size = iVar14 + 1;
                  if (*pbVar30 == 0x7d) {
                    url = (char *)(pbVar30 + 1);
                    local_f8 = pbVar32;
                    goto LAB_0011651f;
                  }
                  pbVar23 = (byte *)glob_00->glob_buffer;
                  pbVar29 = pbVar32;
                }
                else {
                  if (bVar3 < 0x7b) {
                    if (bVar3 == 0x5c) {
                      if (pbVar30[1] != 0) {
                        pbVar30 = pbVar30 + 1;
                        pbVar32 = pbVar29 + 2;
                      }
                    }
                    else if (bVar3 == 0x5d) goto LAB_00116a2f;
                  }
                  else {
                    if (bVar3 == 0x7d) {
                      if ((byte *)url + 1 != pbVar30) {
                        auVar5._8_8_ = 0;
                        auVar5._0_8_ = (long)glob_00->pattern[sVar4].content.Set.size + 1;
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = local_e0;
                        uVar13 = SUB168(auVar5 * auVar8,0);
                        if (SUB168(auVar5 * auVar8,8) == 0) goto LAB_00116631;
                        glob_00->error = "range overflow";
                        glob_00->pos = 0;
                        goto LAB_00116a4d;
                      }
                      pcVar16 = "empty string within braces";
                      goto LAB_00116a3f;
                    }
                    if (bVar3 == 0x7b) goto LAB_0011699e;
                  }
LAB_001166f6:
                  *pbVar23 = *pbVar30;
                  pbVar23 = pbVar23 + 1;
                  pbVar29 = pbVar32;
                }
                pbVar30 = pbVar30 + 1;
              } while( true );
            }
            goto LAB_00116b52;
          }
          pbVar23 = (byte *)url + 1;
          local_f8 = local_f8 + 1;
          pUVar1 = glob_00->pattern + glob_00->size;
          glob_00->pattern[glob_00->size].globindex = local_e4;
          local_e4 = local_e4 + 1;
          ppuVar17 = __ctype_b_loc();
          if (((*ppuVar17)[((byte *)url)[1]] >> 10 & 1) != 0) {
            pUVar1->type = UPTCharRange;
            local_d8 = pUVar1;
            iVar14 = __isoc99_sscanf(pbVar23,"%c-%c%c",&local_e5,&local_e6,&local_e7);
            uVar26 = 1;
            bVar11 = true;
            pbVar29 = pbVar23;
            if (iVar14 == 3) {
              if (local_e7 == ']') {
                pbVar29 = (byte *)url + 5;
              }
              else {
                if (local_e7 != ':') goto LAB_00116aa2;
                piVar19 = __errno_location();
                *piVar19 = 0;
                uVar26 = strtoul((char *)((byte *)url + 5),(char **)local_b8,10);
                if ((*piVar19 == 0) && ((byte *)url + 5 != local_b8[0])) {
                  pbVar29 = local_b8[0] + 1;
                  if (*local_b8[0] != 0x5d) {
                    uVar26 = 0;
                    pbVar29 = pbVar23;
                  }
                }
                else {
                  uVar26 = 0;
                }
              }
              bVar11 = false;
            }
LAB_00116aa2:
            local_f8 = pbVar29 + ((long)local_f8 - (long)pbVar23);
            pcVar16 = "bad range";
            if (((!bVar11) && (pcVar16 = "bad range", 0xffffffff80000000 < uVar26 - 0x80000000)) &&
               ((local_e5 != local_e6 || (pcVar16 = "bad range", uVar26 == 1)))) {
              if (local_e5 == local_e6) {
LAB_00116afb:
                (local_d8->content).CharRange.step = (int)uVar26;
                (local_d8->content).CharRange.min_c = local_e5;
                (local_d8->content).CharRange.ptr_c = local_e5;
                (local_d8->content).CharRange.max_c = local_e6;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = (long)(((int)local_e6 - (int)local_e5) / (int)uVar26 + 1);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = local_e0;
                pcVar16 = "range overflow";
                if (SUB168(auVar7 * auVar10,8) == 0) {
                  CVar31 = CURLE_OK;
                  url = (char *)pbVar29;
                  local_e0 = SUB168(auVar7 * auVar10,0);
                  goto LAB_00116b52;
                }
              }
              else {
                pcVar16 = "bad range";
                if (local_e5 <= local_e6) {
                  uVar27 = (int)local_e6 - (int)local_e5;
                  pcVar16 = "bad range";
                  if (((int)uVar27 < 0x1a) && (pcVar16 = "bad range", uVar26 <= uVar27))
                  goto LAB_00116afb;
                }
              }
            }
            glob_00->error = pcVar16;
            glob_00->pos = (size_t)local_f8;
            CVar31 = CURLE_URL_MALFORMAT;
            url = (char *)pbVar23;
            goto LAB_00116b52;
          }
          if (((*ppuVar17)[((byte *)url)[1]] >> 0xb & 1) == 0) {
            glob_00->error = "bad range specification";
          }
          else {
            pUVar1->type = UPTNumRange;
            (pUVar1->content).NumRange.padlength = 0;
            if ((*pbVar23 == 0x30) && ((*(byte *)((long)*ppuVar17 + 0x61) & 8) != 0)) {
              pbVar29 = (byte *)url + 2;
              do {
                piVar19 = &(pUVar1->content).NumRange.padlength;
                *piVar19 = *piVar19 + 1;
                bVar3 = *pbVar29;
                pbVar29 = pbVar29 + 1;
              } while ((*(byte *)((long)*ppuVar17 + (ulong)bVar3 * 2 + 1) & 8) != 0);
            }
            local_d8 = pUVar1;
            piVar19 = __errno_location();
            *piVar19 = 0;
            uVar26 = strtoul((char *)pbVar23,(char **)local_b8,10);
            if (((*piVar19 == 0) && (local_b8[0] != pbVar23)) &&
               (pbVar29 = local_b8[0], *local_b8[0] == 0x2d)) {
              do {
                do {
                  pbVar29 = pbVar29 + 1;
                  bVar3 = *pbVar29;
                } while (bVar3 == 0x20);
              } while (bVar3 == 9);
              if ((*(byte *)((long)*ppuVar17 + (ulong)bVar3 * 2 + 1) & 8) == 0) {
                local_b8[0] = (byte *)0x0;
                uVar21 = 0;
                uVar24 = 0;
              }
              else {
                *piVar19 = 0;
                uVar21 = strtoul((char *)pbVar29,(char **)local_b8,10);
                if ((*piVar19 != 0) || (uVar24 = 1, *local_b8[0] == 0x3a)) {
                  pbVar29 = local_b8[0] + 1;
                  *piVar19 = 0;
                  uVar24 = strtoul((char *)pbVar29,(char **)local_b8,10);
                  if (*piVar19 != 0) {
                    local_b8[0] = (byte *)0x0;
                  }
                }
                if ((local_b8[0] == (byte *)0x0) || (*local_b8[0] != 0x5d)) {
                  local_b8[0] = (byte *)0x0;
                }
                else {
                  pbVar29 = local_b8[0] + 1;
                }
              }
            }
            else {
              local_b8[0] = (byte *)0x0;
              uVar21 = 0;
              uVar24 = 0;
              pbVar29 = pbVar23;
            }
            local_f8 = pbVar29 + ((long)local_f8 - (long)pbVar23);
            pcVar16 = "bad range";
            if (((local_b8[0] != (byte *)0x0) && (pcVar16 = "bad range", uVar24 != 0)) &&
               ((uVar21 != uVar26 || (pcVar16 = "bad range", uVar24 == 1)))) {
              uVar20 = uVar21 - uVar26;
              if ((uVar20 == 0) ||
                 ((pcVar16 = "bad range", uVar26 <= uVar21 &&
                  (pcVar16 = "bad range", uVar24 <= uVar20)))) {
                (local_d8->content).NumRange.min_n = uVar26;
                (local_d8->content).NumRange.ptr_n = uVar26;
                (local_d8->content).NumRange.max_n = uVar21;
                (local_d8->content).NumRange.step = uVar24;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar20 / uVar24 + 1;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = local_e0;
                pcVar16 = "range overflow";
                if (SUB168(auVar6 * auVar9,8) == 0) {
                  CVar31 = CURLE_OK;
                  url = (char *)pbVar29;
                  local_e0 = SUB168(auVar6 * auVar9,0);
                  goto LAB_00116b52;
                }
              }
            }
            glob_00->error = pcVar16;
          }
          goto LAB_00116a46;
        }
        *pbVar29 = 0;
        sVar4 = glob_00->size;
        pcVar16 = glob_00->glob_buffer;
        glob_00->pattern[sVar4].type = UPTSet;
        glob_00->pattern[sVar4].globindex = -1;
        glob_00->pattern[sVar4].content.NumRange.max_n = 1;
        ppcVar18 = (char **)malloc(8);
        glob_00->pattern[sVar4].content.Set.elements = ppcVar18;
        if (ppcVar18 != (char **)0x0) {
          __dest = (char *)malloc(sVar15 + 1);
          *ppcVar18 = __dest;
          if (__dest != (char *)0x0) {
            memcpy(__dest,pcVar16,sVar15);
            __dest[sVar15] = '\0';
LAB_0011651f:
            CVar31 = CURLE_OK;
            goto LAB_00116b52;
          }
        }
        glob_00->error = "out of memory";
        glob_00->pos = 0;
        CVar31 = CURLE_OUT_OF_MEMORY;
        goto LAB_00116b52;
      }
      goto LAB_00116c7e;
    }
    free(pcVar16);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_00116a2f:
  pcVar16 = "unexpected close bracket";
LAB_00116a3f:
  glob_00->error = pcVar16;
  local_f8 = pbVar32;
LAB_00116a46:
  glob_00->pos = (size_t)local_f8;
  pbVar32 = local_f8;
LAB_00116a4d:
  CVar31 = CURLE_URL_MALFORMAT;
  local_f8 = pbVar32;
LAB_00116a53:
  local_100 = (byte *)url + 1;
  url = (char *)local_100;
LAB_00116b52:
  uVar26 = glob_00->size + 1;
  glob_00->size = uVar26;
  bVar11 = true;
  pcVar16 = "too many globs";
  if (99 < uVar26) {
LAB_00116b75:
    glob_00->error = pcVar16;
    glob_00->pos = (size_t)local_f8;
    bVar11 = false;
  }
  pbVar23 = local_f8;
  if (!bVar11) {
    CVar31 = CURLE_URL_MALFORMAT;
LAB_00116c7e:
    puVar12 = local_c8;
    pFVar22 = local_d0;
    if (CVar31 != CURLE_OK) {
      if ((local_d0 != (FILE *)0x0) &&
         (ppbVar25 = (byte **)glob_00->error, ppbVar25 != (byte **)0x0)) {
        if (glob_00->pos != 0) {
          ppbVar25 = local_b8;
          curl_msnprintf(ppbVar25,0x80,"%s in column %zu");
        }
        curl_mfprintf(pFVar22,"curl: (%d) [globbing] %s\n",CVar31,ppbVar25);
      }
      glob_cleanup(glob_00);
      *puVar12 = 1;
      return CVar31;
    }
    *local_c8 = local_e0;
    *local_c0 = glob_00;
    return CURLE_OK;
  }
  goto LAB_00116356;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0]=0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[128];
      const char *t;
      if(glob_expand->pos) {
        snprintf(text, sizeof(text), "%s in column %zu", glob_expand->error,
                 glob_expand->pos);
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) [globbing] %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}